

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  char *pcVar1;
  string local_68 [48];
  string local_38 [8];
  string dir;
  cmGeneratorTarget *gt_local;
  cmGlobalNinjaGenerator *this_local;
  
  dir.field_2._8_8_ = gt;
  std::__cxx11::string::string(local_38);
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory
                     (*(cmLocalGenerator **)(dir.field_2._8_8_ + 0x10));
  std::__cxx11::string::operator+=(local_38,pcVar1);
  std::__cxx11::string::operator+=(local_38,"/");
  (**(code **)(**(long **)(dir.field_2._8_8_ + 0x10) + 0x60))(local_68);
  std::__cxx11::string::operator+=(local_38,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::operator+=(local_38,"/");
  std::__cxx11::string::operator=((string *)(dir.field_2._8_8_ + 0x20),local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir;
  dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
  dir += "/";
  dir += gt->LocalGenerator->GetTargetDirectory(gt);
  dir += "/";
  gt->ObjectDirectory = dir;
}